

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int vs_ue(bitstream *str,uint32_t *val)

{
  int iVar1;
  bitstream *in_RSI;
  int *in_RDI;
  uint32_t tmp;
  int lzb;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  undefined4 uVar2;
  int iVar3;
  int local_4;
  
  iVar3 = 0;
  if (*in_RDI == 0) {
    uVar2 = 0;
    if (in_RSI->dir == ~VS_ENCODE) {
      fprintf(_stderr,"Exp-Golomb number larger than 2^32-2\n");
      local_4 = 1;
    }
    else {
      while ((1 << ((char)iVar3 + 1U & 0x1f)) - VS_DECODE <= in_RSI->dir) {
        iVar1 = vs_u(in_RSI,(uint32_t *)CONCAT44(iVar3,uVar2),in_stack_ffffffffffffffdc);
        if (iVar1 != 0) {
          return 1;
        }
        iVar3 = iVar3 + 1;
      }
      iVar1 = vs_u(in_RSI,(uint32_t *)CONCAT44(iVar3,1),in_stack_ffffffffffffffdc);
      if (iVar1 == 0) {
        iVar3 = vs_u(in_RSI,(uint32_t *)
                            CONCAT44(iVar3,in_RSI->dir - ((1 << ((byte)iVar3 & 0x1f)) + -1)),
                     in_stack_ffffffffffffffdc);
        if (iVar3 == 0) {
          local_4 = 0;
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
  }
  else {
    do {
      iVar1 = iVar3;
      iVar3 = vs_u(in_RSI,(uint32_t *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffdc);
      if (iVar3 != 0) {
        return 1;
      }
      iVar3 = iVar1 + 1;
    } while (in_stack_ffffffffffffffe0 == 0);
    if (iVar1 < 0x20) {
      iVar3 = vs_u(in_RSI,(uint32_t *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffdc);
      if (iVar3 == 0) {
        in_RSI->dir = (in_stack_ffffffffffffffe0 + (1 << ((byte)iVar1 & 0x1f))) - VS_DECODE;
        local_4 = 0;
      }
      else {
        local_4 = 1;
      }
    }
    else {
      fprintf(_stderr,"Exp-Golomb number larger than 2^32-2\n");
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int vs_ue(struct bitstream *str, uint32_t *val) {
	int lzb = 0;
	uint32_t tmp;
	if (str->dir == VS_ENCODE) {
		tmp = 0;
		if (*val >= (uint32_t)0xffffffff) {
			fprintf (stderr, "Exp-Golomb number larger than 2^32-2\n");
			return 1;
		}
		while (*val >= (uint32_t)(1u << (lzb + 1)) - 1) {
			if (vs_u(str, &tmp, 1))
				return 1;
			lzb++;
		}
		tmp = 1;
		if (vs_u(str, &tmp, 1))
			return 1;
		tmp = *val - ((1 << lzb) - 1);
		if (vs_u(str, &tmp, lzb))
			return 1;
		return 0;
	} else {
		do {
			if (vs_u(str, &tmp, 1))
				return 1;
			lzb++;
		} while (!tmp);
		lzb--;
		if (lzb > 31) {
			fprintf (stderr, "Exp-Golomb number larger than 2^32-2\n");
			return 1;
		}
		if (vs_u(str, &tmp, lzb))
			return 1;
		*val = tmp + (1u << lzb) - 1;
		return 0;
	}
}